

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::Detach(ConsumerEndpointImpl *this,string *key)

{
  TaskRunner *pTVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  code cVar4;
  __shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  undefined1 local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  WeakPtr<perfetto::TracingServiceImpl::ConsumerEndpointImpl> weak_this;
  
  cVar4 = (code)DetachConsumer(this->service_,this,key);
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&weak_this,
               (__shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&this->weak_ptr_factory_);
  pTVar1 = this->task_runner_;
  std::
  __shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_78,
               (__shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                *)&weak_this);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_68 = cVar4;
  local_58._M_unused._M_object = operator_new(0x18);
  uVar2 = local_78._M_refcount._M_pi._0_4_;
  uVar3 = local_78._M_refcount._M_pi._4_4_;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)local_58._M_unused._0_8_ = local_78._M_ptr._0_4_;
  *(undefined4 *)((long)local_58._M_unused._0_8_ + 4) = local_78._M_ptr._4_4_;
  *(undefined4 *)((long)local_58._M_unused._0_8_ + 8) = uVar2;
  *(undefined4 *)((long)local_58._M_unused._0_8_ + 0xc) = uVar3;
  local_78._M_ptr = (element_type *)0x0;
  *(code *)((long)local_58._M_unused._0_8_ + 0x10) = cVar4;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59615:26)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59615:26)>
             ::_M_manager;
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&weak_this.handle_.
              super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::Detach(const std::string& key) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  bool success = service_->DetachConsumer(this, key);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, success] {
    if (weak_this)
      weak_this->consumer_->OnDetach(success);
  });
}